

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_code.cc
# Opt level: O1

void re2c::exact_uint(OutputFile *o,size_t width)

{
  OutputFile *this;
  char *s;
  
  switch(width) {
  case 1:
    s = "unsigned char";
    break;
  case 2:
    s = "unsigned short";
    break;
  default:
    this = OutputFile::ws(o,"uint");
    o = OutputFile::wu64(this,width << 3);
    s = "_t";
    break;
  case 4:
    s = "unsigned int";
    break;
  case 8:
    s = "unsigned long";
  }
  OutputFile::ws(o,s);
  return;
}

Assistant:

static void exact_uint (OutputFile & o, size_t width)
{
	if (width == sizeof (char))
	{
		o.ws("unsigned char");
	}
	else if (width == sizeof (short))
	{
		o.ws("unsigned short");
	}
	else if (width == sizeof (int))
	{
		o.ws("unsigned int");
	}
	else if (width == sizeof (long))
	{
		o.ws("unsigned long");
	}
	else
	{
		o.ws("uint").wu64 (width * 8).ws("_t");
	}
}